

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

ssize_t __thiscall
booster::locale::basic_message<wchar_t>::write
          (basic_message<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  wchar_t *pwVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  wostream *pwVar4;
  string_type buffer;
  locale lStack_38;
  undefined4 *local_30;
  undefined8 local_28;
  undefined4 local_20 [4];
  
  pwVar4 = (wostream *)CONCAT44(in_register_00000034,__fd);
  std::locale::locale(&lStack_38,(locale *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18) + 0xd0));
  booster::locale::ios_info::get((ios_base *)(pwVar4 + *(long *)(*(long *)pwVar4 + -0x18)));
  uVar1 = booster::locale::ios_info::domain_id();
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  pwVar2 = (wchar_t *)write(this,(int)&lStack_38,(void *)(ulong)uVar1,(size_t)&local_30);
  std::operator<<(pwVar4,pwVar2);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  sVar3 = std::locale::~locale(&lStack_38);
  return sVar3;
}

Assistant:

void write(std::basic_ostream<char_type> &out) const
            {
                std::locale const &loc = out.getloc();
                int id = ios_info::get(out).domain_id();
                string_type buffer;
                out << write(loc,id,buffer);
            }